

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict param_type_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  node *n;
  node_t_conflict pnVar3;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict op3;
  node_t_conflict op4;
  pos_t p;
  pos_t pVar6;
  undefined4 in_stack_ffffffffffffff98;
  pos_t pos;
  
  ppVar1 = c2m_ctx->parse_ctx;
  n = new_node(c2m_ctx,N_LIST);
  if (*(short *)ppVar1->curr_token != 0x29) {
    do {
      pnVar3 = declaration_specs(c2m_ctx,no_err_p,(node_t_conflict)0x0);
      if (pnVar3 == &err_struct) {
        return &err_struct;
      }
      if ((*(short *)ppVar1->curr_token == 0x2c) || (*(short *)ppVar1->curr_token == 0x29)) {
        pnVar4 = new_node(c2m_ctx,N_IGNORE);
        pnVar5 = new_node(c2m_ctx,N_LIST);
        pnVar4 = new_node2(c2m_ctx,N_DECL,pnVar4,pnVar5);
LAB_00166cc0:
        pnVar3 = new_node2(c2m_ctx,N_TYPE,pnVar3,pnVar4);
      }
      else {
        pnVar4 = try_f(c2m_ctx,param_type_abstract_declarator);
        if (pnVar4 != &err_struct) goto LAB_00166cc0;
        pnVar4 = declarator(c2m_ctx,no_err_p);
        if (pnVar4 == &err_struct) {
          return &err_struct;
        }
        pnVar5 = try_attr_spec(c2m_ctx,ppVar1->curr_token->pos,(node_t_conflict *)0x0);
        if (pnVar5 == &err_struct) {
          pnVar5 = new_node(c2m_ctx,N_IGNORE);
        }
        pVar6 = get_node_pos(c2m_ctx,&err_struct);
        p.fname = pVar6._8_8_;
        op3 = new_node(c2m_ctx,N_IGNORE);
        op4 = new_node(c2m_ctx,N_IGNORE);
        p._8_8_ = pnVar3;
        pnVar3 = new_pos_node5(c2m_ctx,(node_code_t)pVar6.fname,p,pnVar4,pnVar5,op3,op4,
                               (node_t_conflict)CONCAT44(no_err_p,in_stack_ffffffffffffff98));
      }
      op_append(c2m_ctx,n,pnVar3);
      iVar2 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        return n;
      }
    } while (*(short *)ppVar1->curr_token != 0x10f);
    iVar2 = match(c2m_ctx,0x10f,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      n = &err_struct;
      if (ppVar1->record_level == 0) {
        syntax_error(c2m_ctx,"...");
      }
    }
    else {
      pnVar3 = new_pos_node(c2m_ctx,N_DOTS,pos);
      op_append(c2m_ctx,n,pnVar3);
    }
  }
  return n;
}

Assistant:

D (param_type_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, attrs, op1, op2, r = err_node;
  int comma_p;
  pos_t pos;

  list = new_node (c2m_ctx, N_LIST);
  if (C (')')) return list;
  for (;;) { /* parameter-list, parameter-declaration */
    PA (declaration_specs, NULL);
    op1 = r;
    if (C (',') || C (')')) {
      r = new_node2 (c2m_ctx, N_TYPE, op1,
                     new_node2 (c2m_ctx, N_DECL, new_node (c2m_ctx, N_IGNORE),
                                new_node (c2m_ctx, N_LIST)));
    } else if ((op2 = TRY (param_type_abstract_declarator)) != err_node) {
      /* Try param_type_abstract_declarator first for possible func
         type case ("<res_type> (<typedef_name>)") which can conflict with declarator ("<res_type>
         (<new decl identifier>)")  */
      r = new_node2 (c2m_ctx, N_TYPE, op1, op2);
    } else {
      P (declarator);
      attrs = try_attr_spec (c2m_ctx, curr_token->pos, NULL);
      if (attrs == err_node) attrs = new_node (c2m_ctx, N_IGNORE);
      r = new_pos_node5 (c2m_ctx, N_SPEC_DECL, POS (op2), op1, r, attrs,
                         new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE));
    }
    op_append (c2m_ctx, list, r);
    comma_p = FALSE;
    if (!M (',')) break;
    comma_p = TRUE;
    if (C (T_DOTS)) break;
  }
  if (comma_p) {
    PTP (T_DOTS, pos);
    op_append (c2m_ctx, list, new_pos_node (c2m_ctx, N_DOTS, pos));
  }
  return list;
}